

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_aggregate_expression.cpp
# Opt level: O3

bool duckdb::IsFunctionallyDependent
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *deps)

{
  pointer puVar1;
  int iVar2;
  pointer pEVar3;
  type pEVar4;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range1;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *dep;
  pointer this;
  bool are_dependent;
  bool has_children;
  byte local_52;
  byte local_51;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expr);
  iVar2 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[0xc])(pEVar3);
  if ((char)iVar2 == '\0') {
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(expr);
    iVar2 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar3);
    local_52 = 1;
    if ((char)iVar2 == '\0') {
      puVar1 = (deps->
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this = (deps->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; this != puVar1; this = this + 1) {
        pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(expr);
        pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(this);
        iVar2 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[10])(pEVar3,pEVar4);
        if ((char)iVar2 != '\0') {
          return true;
        }
      }
      local_51 = 0;
      local_52 = 1;
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(expr);
      local_50._8_8_ = 0;
      local_50._M_unused._M_object = operator_new(0x18);
      *(byte **)local_50._M_unused._0_8_ = &local_51;
      *(byte **)((long)local_50._M_unused._0_8_ + 8) = &local_52;
      *(vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        **)((long)local_50._M_unused._0_8_ + 0x10) = deps;
      local_38 = ::std::
                 _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_aggregate_expression.cpp:44:47)>
                 ::_M_invoke;
      local_40 = ::std::
                 _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_aggregate_expression.cpp:44:47)>
                 ::_M_manager;
      ExpressionIterator::EnumerateChildren
                (pEVar4,(function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&)>
                         *)&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      local_52 = local_52 & local_51;
    }
  }
  else {
    local_52 = 0;
  }
  return (bool)local_52;
}

Assistant:

static bool IsFunctionallyDependent(const unique_ptr<Expression> &expr, const vector<unique_ptr<Expression>> &deps) {
	//	Volatile expressions can't depend on anything else
	if (expr->IsVolatile()) {
		return false;
	}
	//	Constant expressions are always FD
	if (expr->IsFoldable()) {
		return true;
	}
	// If the expression matches ANY of the dependencies, then it is FD on them
	for (const auto &dep : deps) {
		// We don't need to check volatility of the dependencies because we checked it for the expression.
		if (expr->Equals(*dep)) {
			return true;
		}
	}

	// The expression doesn't match any dependency, so check ALL children.
	bool has_children = false;
	bool are_dependent = true;
	ExpressionIterator::EnumerateChildren(*expr, [&](unique_ptr<Expression> &child) {
		has_children = true;
		are_dependent &= IsFunctionallyDependent(child, deps);
	});
	return has_children && are_dependent;
}